

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O1

void __thiscall carver::Carver::carveImage(Carver *this,string *outputPath)

{
  Mat target;
  void *local_c8;
  undefined8 uStack_c0;
  long local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _InputArray local_90;
  
  carveImage((Carver *)&stack0xffffffffffffff88);
  local_90.sz.width = 0;
  local_90.sz.height = 0;
  local_90.flags = 0x1010000;
  local_b8 = 0;
  local_c8 = (void *)0x0;
  uStack_c0 = 0;
  local_90.obj = (Carver *)&stack0xffffffffffffff88;
  cv::imwrite((string *)outputPath,&local_90,(vector *)&local_c8);
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,local_b8 - (long)local_c8);
  }
  std::operator+(&local_b0,"Saved output image as ",outputPath);
  log_(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  cv::Mat::~Mat((Mat *)&stack0xffffffffffffff88);
  return;
}

Assistant:

void Carver::carveImage(string outputPath) {
    cv::Mat target = carveImage();
    cv::imwrite(outputPath, target);
    log_("Saved output image as " + outputPath);
}